

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

void dump_regressor(vw *all,io_buf *buf,bool as_text)

{
  byte in_DL;
  long *in_RSI;
  long in_RDI;
  string unused;
  options_i *in_stack_000011b0;
  string *in_stack_000011b8;
  undefined1 in_stack_000011c6;
  undefined1 in_stack_000011c7;
  io_buf *in_stack_000011c8;
  vw *in_stack_000011d0;
  string *this;
  io_buf *in_stack_ffffffffffffffb8;
  learner<char,_char> *in_stack_ffffffffffffffc0;
  string local_38 [39];
  byte local_11;
  long *local_10;
  long local_8;
  undefined2 uVar1;
  
  local_11 = in_DL & 1;
  this = local_38;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(this);
  uVar1 = (undefined2)((ulong)this >> 0x30);
  save_load_header(in_stack_000011d0,in_stack_000011c8,(bool)in_stack_000011c7,
                   (bool)in_stack_000011c6,in_stack_000011b8,in_stack_000011b0);
  if (*(long *)(local_8 + 0x28) != 0) {
    LEARNER::learner<char,_char>::save_load
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,SUB21((ushort)uVar1 >> 8,0),
               SUB21(uVar1,0));
  }
  (**(code **)(*local_10 + 0x38))();
  (**(code **)(*local_10 + 0x40))();
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void dump_regressor(vw& all, io_buf& buf, bool as_text)
{
  std::string unused;
  save_load_header(all, buf, false, as_text, unused, *all.options);
  if (all.l != nullptr)
    all.l->save_load(buf, false, as_text);

  buf.flush();  // close_file() should do this for me ...
  buf.close_file();
}